

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall slang::ast::Compilation::forceElaborate(Compilation *this,Symbol *symbol)

{
  table_arrays<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  arrays;
  table_arrays<const_slang::ast::InstanceBodySymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  arrays_1;
  table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  arrays_2;
  table_arrays<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  arrays_3;
  DiagnosticVisitor local_1d8;
  
  local_1d8.numErrors = &this->numErrors;
  local_1d8.errorLimit = (this->options).errorLimit;
  local_1d8.errorLimit = -(uint)(local_1d8.errorLimit == 0) | local_1d8.errorLimit;
  local_1d8.genericClasses.super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_ =
       (pointer)local_1d8.genericClasses.
                super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.firstElement;
  local_1d8.disableCache = false;
  local_1d8.hierarchyProblem = false;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .arrays.groups_size_index = 0x3f;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .arrays.groups_size_mask = 1;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .size_ctrl.ml = 0;
  local_1d8.instanceCache.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_slang::hash<ast::InstanceCacheKey>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  .size_ctrl.size = 0;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .arrays.groups_size_index = 0x3f;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .arrays.groups_size_mask = 1;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .size_ctrl.ml = 0;
  local_1d8.activeInstanceBodies.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  .size_ctrl.size = 0;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .arrays.groups_size_index = 0x3f;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .arrays.groups_size_mask = 1;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .size_ctrl.ml = 0;
  local_1d8.usedIfacePorts.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  .size_ctrl.size = 0;
  local_1d8.genericClasses.super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.len = 0;
  local_1d8.genericClasses.super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.cap = 5;
  local_1d8.dpiImports.super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.data_ =
       (pointer)local_1d8.dpiImports.super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.
                firstElement;
  local_1d8.dpiImports.super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.len = 0;
  local_1d8.dpiImports.super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.cap = 5;
  local_1d8.externIfaceProtos.super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.data_
       = (pointer)local_1d8.externIfaceProtos.
                  super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.firstElement;
  local_1d8.externIfaceProtos.super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.len =
       0;
  local_1d8.externIfaceProtos.super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.cap =
       5;
  local_1d8.modportsWithExports.
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .data_ = (pointer)local_1d8.modportsWithExports.
                    super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
                    .firstElement;
  local_1d8.modportsWithExports.
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .len = 0;
  local_1d8.modportsWithExports.
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .cap = 2;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .arrays.groups_size_index = 0x3f;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .arrays.groups_size_mask = 1;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .size_ctrl.ml = 0;
  local_1d8.timingPathMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
  .size_ctrl.size = 0;
  local_1d8.visitInstances = false;
  local_1d8.compilation = this;
  Symbol::visit<slang::ast::DiagnosticVisitor&>(symbol,&local_1d8);
  DiagnosticVisitor::~DiagnosticVisitor(&local_1d8);
  return;
}

Assistant:

void Compilation::forceElaborate(const Symbol& symbol) {
    SLANG_ASSERT(!isFrozen());
    DiagnosticVisitor visitor(*this, numErrors,
                              options.errorLimit == 0 ? UINT32_MAX : options.errorLimit);
    visitor.visitInstances = false;
    symbol.visit(visitor);
}